

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_30::SocketAddress::bind
          (SocketAddress *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int value;
  Fault f;
  
  if (this->wildcard == true) {
    value = 0;
    do {
      iVar1 = setsockopt(__fd,0x29,0x1a,&value,4);
      if (-1 < iVar1) goto LAB_002f3959;
      iVar1 = _::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
    if (iVar1 != 0) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x22d,iVar1,"setsockopt(sockfd, IPPROTO_IPV6, IPV6_V6ONLY, &value, sizeof(value))"
                 ,"");
      _::Debug::Fault::fatal(&f);
    }
  }
LAB_002f3959:
  do {
    iVar1 = ::bind(__fd,(sockaddr *)&(this->addr).generic,this->addrlen);
    if (-1 < iVar1) {
      return iVar1;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return 0;
  }
  toString((String *)&f,this);
  _::Debug::Fault::Fault<int,kj::String>
            ((Fault *)&value,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x231,iVar1,"::bind(sockfd, &addr.generic, addrlen)","toString()",(String *)&f);
  Array<char>::~Array((Array<char> *)&f);
  _::Debug::Fault::fatal((Fault *)&value);
}

Assistant:

void bind(int sockfd) const {
#if !defined(__OpenBSD__)
    if (wildcard) {
      // Disable IPV6_V6ONLY because we want to handle both ipv4 and ipv6 on this socket.  (The
      // default value of this option varies across platforms.)
      int value = 0;
      KJ_SYSCALL(setsockopt(sockfd, IPPROTO_IPV6, IPV6_V6ONLY, &value, sizeof(value)));
    }
#endif

    KJ_SYSCALL(::bind(sockfd, &addr.generic, addrlen), toString());
  }